

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVHandlePtr.h
# Opt level: O3

void __thiscall
cm::uv_handle_ptr_base_<uv_stream_s>::uv_handle_ptr_base_<cm::uv_tty_ptr,void>
          (uv_handle_ptr_base_<uv_stream_s> *this,uv_tty_ptr *rhs)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uv_stream_s *__tmp;
  uv_stream_t *puVar2;
  
  (this->handle).super___shared_ptr<uv_stream_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->handle).super___shared_ptr<uv_stream_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  puVar2 = uv_tty_ptr::operator_cast_to_uv_stream_s_(rhs);
  p_Var1 = (rhs->super_uv_handle_ptr_<uv_tty_s>).super_uv_handle_ptr_base_<uv_tty_s>.handle.
           super___shared_ptr<uv_tty_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->handle).super___shared_ptr<uv_stream_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = puVar2;
  this_00 = (this->handle).super___shared_ptr<uv_stream_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (this->handle).super___shared_ptr<uv_stream_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  p_Var1 = (rhs->super_uv_handle_ptr_<uv_tty_s>).super_uv_handle_ptr_base_<uv_tty_s>.handle.
           super___shared_ptr<uv_tty_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (rhs->super_uv_handle_ptr_<uv_tty_s>).super_uv_handle_ptr_base_<uv_tty_s>.handle.
  super___shared_ptr<uv_tty_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (rhs->super_uv_handle_ptr_<uv_tty_s>).super_uv_handle_ptr_base_<uv_tty_s>.handle.
  super___shared_ptr<uv_tty_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    return;
  }
  return;
}

Assistant:

uv_handle_ptr_base_(S&& rhs)
  {
    // This will force a compiler error if rhs doesn't have a casting
    // operator to get T*
    this->handle = std::shared_ptr<T>(rhs.handle, rhs);
    rhs.handle.reset();
  }